

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O0

void __thiscall
Statsd::StatsdClient::setConfig
          (StatsdClient *this,string *host,uint16_t port,string *prefix,uint64_t batchsize,
          uint64_t sendInterval,int gaugePrecision)

{
  UDPSender *this_00;
  string local_78 [32];
  detail local_58 [32];
  uint64_t local_38;
  uint64_t sendInterval_local;
  uint64_t batchsize_local;
  string *prefix_local;
  string *psStack_18;
  uint16_t port_local;
  string *host_local;
  StatsdClient *this_local;
  
  local_38 = sendInterval;
  sendInterval_local = batchsize;
  batchsize_local = (uint64_t)prefix;
  prefix_local._6_2_ = port;
  psStack_18 = host;
  host_local = &this->m_prefix;
  std::__cxx11::string::string(local_78,(string *)prefix);
  detail::sanitizePrefix(local_58,(string *)local_78);
  std::__cxx11::string::operator=((string *)this,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  this_00 = (UDPSender *)operator_new(0xf0);
  UDPSender::UDPSender(this_00,psStack_18,prefix_local._6_2_,sendInterval_local,local_38);
  std::unique_ptr<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>::reset
            (&this->m_sender,this_00);
  this->m_gaugePrecision = gaugePrecision;
  return;
}

Assistant:

inline void StatsdClient::setConfig(const std::string& host,
                                    const uint16_t port,
                                    const std::string& prefix,
                                    const uint64_t batchsize,
                                    const uint64_t sendInterval,
                                    const int gaugePrecision) noexcept {
    m_prefix = detail::sanitizePrefix(prefix);
    m_sender.reset(new UDPSender(host, port, batchsize, sendInterval));
    m_gaugePrecision = gaugePrecision;
}